

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void slang::ast::findIfaces
               (ClassType *type,SmallVectorBase<const_slang::ast::Type_*> *ifaces,
               SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
               *visited)

{
  bool bVar1;
  Type *pTVar2;
  ClassType *type_00;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar3;
  Type *base;
  Type *local_80;
  Type *iface;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *local_58;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2;
  EntryPointer local_48;
  undefined1 local_40;
  ClassType *local_38;
  EntryPointer local_30;
  undefined1 local_28;
  SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
  *local_20;
  SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
  *visited_local;
  SmallVectorBase<const_slang::ast::Type_*> *ifaces_local;
  ClassType *type_local;
  
  local_20 = visited;
  visited_local =
       (SmallSet<const_slang::ast::Symbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
        *)ifaces;
  ifaces_local = (SmallVectorBase<const_slang::ast::Type_*> *)type;
  if ((type->isInterface & 1U) != 0) {
    local_38 = type;
    pVar3 = ska::
            flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::ClassType_const*>
                      ((flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&visited->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,&local_38);
    local_48 = (EntryPointer)pVar3.first.current;
    local_40 = pVar3.second;
    local_30 = local_48;
    local_28 = local_40;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __range2 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)ifaces_local;
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)visited_local,(Type **)&__range2);
    }
  }
  ___begin2 = ClassType::getImplementedInterfaces((ClassType *)ifaces_local);
  local_58 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)&__begin2;
  __end2 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                     (local_58);
  iface = (Type *)nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::
                  end(local_58);
  for (; (Type *)__end2 != iface; __end2 = __end2 + 1) {
    local_80 = *__end2;
    pVar3 = ska::
            flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
            ::emplace<slang::ast::Type_const*&>
                      ((flat_hash_set<slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,std::equal_to<slang::ast::Symbol_const*>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,4ul>>
                        *)&local_20->
                           super_flat_hash_set<const_slang::ast::Symbol_*,_std::hash<const_Symbol_*>,_std::equal_to<const_Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_4UL>_>
                       ,&local_80);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)visited_local,&local_80);
    }
  }
  pTVar2 = ClassType::getBaseClass((ClassType *)ifaces_local);
  if ((pTVar2 != (Type *)0x0) && (bVar1 = Type::isError(pTVar2), !bVar1)) {
    pTVar2 = Type::getCanonicalType(pTVar2);
    type_00 = Symbol::as<slang::ast::ClassType>(&pTVar2->super_Symbol);
    findIfaces(type_00,(SmallVectorBase<const_slang::ast::Type_*> *)visited_local,local_20);
  }
  return;
}

Assistant:

static void findIfaces(const ClassType& type, SmallVectorBase<const Type*>& ifaces,
                       SmallSet<const Symbol*, 4>& visited) {
    if (type.isInterface) {
        if (visited.emplace(&type).second)
            ifaces.push_back(&type);
    }

    for (auto iface : type.getImplementedInterfaces()) {
        if (visited.emplace(iface).second)
            ifaces.push_back(iface);
    }

    if (auto base = type.getBaseClass(); base && !base->isError())
        findIfaces(base->getCanonicalType().as<ClassType>(), ifaces, visited);
}